

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

void NscPushAssignment(CNscPStackEntry *pOut,NscPCode nCode,NscType nType,CNscPStackEntry *pLhs,
                      CNscPStackEntry *pRhs)

{
  uchar *puVar1;
  bool bVar2;
  
  bVar2 = CNscPStackEntry::IsSimpleVariable(pLhs);
  if (bVar2) {
    if (g_pCtx->m_fWarnOnAssignRHSIsAssignment == true) {
      bVar2 = CNscPStackEntry::IsAssignment(pRhs);
      if (bVar2) {
        CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningNestedRHSAssign);
      }
    }
    puVar1 = pLhs->m_pauchData;
    CNscPStackEntry::PushAssignment
              (pOut,nCode,nType,*(NscType *)(puVar1 + 0x10),pRhs->m_nType,*(size_t *)(puVar1 + 0x18)
               ,*(int *)(puVar1 + 0x20),*(int *)(puVar1 + 0x24),*(UINT32 *)(puVar1 + 0x28),
               pRhs->m_pauchData,pRhs->m_nDataSize);
  }
  else {
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorAssignLHSNotVariable);
    nType = NscType_Error;
  }
  CNscPStackEntry::SetType(pOut,nType);
  return;
}

Assistant:

void NscPushAssignment (CNscPStackEntry *pOut, NscPCode nCode,
	NscType nType, CNscPStackEntry *pLhs, CNscPStackEntry *pRhs)
{

	//
	// Validate 
	//

	if (!pLhs ->IsSimpleVariable ())
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorAssignLHSNotVariable);
		pOut ->SetType (NscType_Error);
		return;
	}

	//
	// If we are detecting the standard compiler's parser limitation with
	// nested assignments
	//

	if (g_pCtx ->GetWarnOnAssignRHSIsAssignment () && pRhs ->IsAssignment ())
		g_pCtx ->GenerateMessage (NscMessage_WarningNestedRHSAssign);

	//
	// Create the pcode
	//

	NscPCodeVariable *pv = (NscPCodeVariable *) pLhs ->GetData ();
	pOut ->PushAssignment (nCode, nType, pv ->nSourceType, pRhs ->GetType (),
		pv ->nSymbol, pv ->nElement, pv ->nStackOffset, pv ->ulFlags, 
		pRhs ->GetData (), pRhs ->GetDataSize ());
	pOut ->SetType (nType);
	return;
}